

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

matrix __thiscall sptk::swipe::copym(swipe *this,matrix yr_matrix)

{
  ulong uVar1;
  uint xSz;
  matrix mVar2;
  
  xSz = (uint)this;
  mVar2 = makem(xSz,(int)((ulong)this >> 0x20));
  if (0 < (int)xSz) {
    uVar1 = 0;
    do {
      memcpy(mVar2.m[uVar1],*(void **)(yr_matrix._0_8_ + uVar1 * 8),
             (long)this >> 0x1d & 0xfffffffffffffff8);
      uVar1 = uVar1 + 1;
    } while ((xSz & 0x7fffffff) != uVar1);
  }
  return mVar2;
}

Assistant:

matrix copym(matrix yr_matrix) {
    matrix nw_matrix = makem(yr_matrix.x, yr_matrix.y);
    int i;
    for (i = 0; i < yr_matrix.x; i++) // does not assume contiguity
        memcpy(nw_matrix.m[i], yr_matrix.m[i],
               sizeof(double) * yr_matrix.y);
    return(nw_matrix);
}